

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PcacheSetSpillsize(PCache *p,int mxPage)

{
  int local_18;
  int local_14;
  int res;
  int mxPage_local;
  PCache *p_local;
  
  if (mxPage != 0) {
    local_14 = mxPage;
    if (mxPage < 0) {
      local_14 = (int)(((long)mxPage * -0x400) / (long)(p->szPage + p->szExtra));
    }
    p->szSpill = local_14;
  }
  local_18 = numberOfCachePages(p);
  if (local_18 < p->szSpill) {
    local_18 = p->szSpill;
  }
  return local_18;
}

Assistant:

SQLITE_PRIVATE int sqlite3PcacheSetSpillsize(PCache *p, int mxPage){
  int res;
  assert( p->pCache!=0 );
  if( mxPage ){
    if( mxPage<0 ){
      mxPage = (int)((-1024*(i64)mxPage)/(p->szPage+p->szExtra));
    }
    p->szSpill = mxPage;
  }
  res = numberOfCachePages(p);
  if( res<p->szSpill ) res = p->szSpill; 
  return res;
}